

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::addChild<(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,int *point,int direction,MultiIndexSet *exclude,
          Data2D<int> *destination)

{
  bool bVar1;
  int iVar2;
  int i;
  int kid_number;
  vector<int,_std::allocator<int>_> kid;
  allocator_type local_49;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&local_48,point,
             point + (this->super_BaseCanonicalGrid).num_dimensions,&local_49);
  for (kid_number = 0; kid_number != 2; kid_number = kid_number + 1) {
    iVar2 = RuleLocal::getKid<(TasGrid::RuleLocal::erule)2>(point[direction],kid_number);
    local_48._M_impl.super__Vector_impl_data._M_start[direction] = iVar2;
    if (iVar2 != -1) {
      bVar1 = MultiIndexSet::missing(exclude,(vector<int,_std::allocator<int>_> *)&local_48);
      if (bVar1) {
        Data2D<int>::appendStrip(destination,(vector<int,_std::allocator<int>_> *)&local_48);
      }
    }
  }
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void GridLocalPolynomial::addChild(const int point[], int direction, const MultiIndexSet &exclude, Data2D<int> &destination) const{
    std::vector<int> kid(point, point + num_dimensions);
    int max_1d_kids = RuleLocal::getMaxNumKids<effrule>();
    for(int i=0; i<max_1d_kids; i++){
        kid[direction] = RuleLocal::getKid<effrule>(point[direction], i);
        if ((kid[direction] != -1) && exclude.missing(kid)){
            destination.appendStrip(kid);
        }
    }
}